

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O0

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
::init_from_extent_gen
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           *this,extent_gen<2UL> *ranges)

{
  const_mem_fun_ref_t<long,_boost::detail::multi_array::extent_range<long,_unsigned_long>_>
  __unary_op;
  const_mem_fun_ref_t<unsigned_long,_boost::detail::multi_array::extent_range<long,_unsigned_long>_>
  __unary_op_00;
  const_iterator __last;
  const_iterator __first;
  iterator f;
  const_iterator peVar1;
  const_iterator extents_iter;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  *this_00;
  array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL> *in_RSI;
  long in_RDI;
  extent_list extents;
  undefined8 in_stack_ffffffffffffff80;
  array<long,_2UL> local_40;
  code *local_30;
  undefined8 local_28;
  const_mem_fun_ref_t<long,_boost::detail::multi_array::extent_range<long,_unsigned_long>_>
  *local_20;
  array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL> *local_10;
  
  local_10 = in_RSI;
  __last = array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL>::begin(in_RSI);
  __first = array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL>::end(local_10)
  ;
  f = array<long,_2UL>::begin((array<long,_2UL> *)(in_RDI + 0x40));
  local_30 = detail::multi_array::extent_range<long,_unsigned_long>::start;
  local_28 = 0;
  local_20 = mem_fun_ref<long,boost::detail::multi_array::extent_range<long,unsigned_long>>
                       ((offset_in_extent_range<long,_unsigned_long>_to_subr)f);
  __unary_op._8_8_ = in_stack_ffffffffffffff80;
  __unary_op.ptr = (offset_in_extent_range<long,_unsigned_long>_to_subr)f;
  std::
  transform<boost::detail::multi_array::extent_range<long,unsigned_long>const*,long*,boost::const_mem_fun_ref_t<long,boost::detail::multi_array::extent_range<long,unsigned_long>>>
            (__first,__last,(long *)0x917a51,__unary_op);
  peVar1 = array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL>::begin
                     (local_10);
  extents_iter = array<boost::detail::multi_array::extent_range<long,_unsigned_long>,_2UL>::end
                           (local_10);
  this_00 = (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             *)array<long,_2UL>::begin(&local_40);
  mem_fun_ref<unsigned_long,boost::detail::multi_array::extent_range<long,unsigned_long>>
            ((offset_in_extent_range<long,_unsigned_long>_to_subr)f);
  __unary_op_00._8_8_ = peVar1;
  __unary_op_00.ptr = (offset_in_extent_range<long,_unsigned_long>_to_subr)f;
  std::
  transform<boost::detail::multi_array::extent_range<long,unsigned_long>const*,long*,boost::const_mem_fun_ref_t<unsigned_long,boost::detail::multi_array::extent_range<long,unsigned_long>>>
            (__first,__last,(long *)0x917ad6,__unary_op_00);
  array<long,_2UL>::begin(&local_40);
  const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
  ::init_multi_array_ref<long*>(this_00,(long *)extents_iter);
  return;
}

Assistant:

void init_from_extent_gen(const
                        detail::multi_array::
                        extent_gen<NumDims>& ranges) { 
    
    typedef boost::array<index,NumDims> extent_list;

    // get the index_base values
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              index_base_list_.begin(),
              boost::mem_fun_ref(&extent_range::start));

    // calculate the extents
    extent_list extents;
    std::transform(ranges.ranges_.begin(),ranges.ranges_.end(),
              extents.begin(),
              boost::mem_fun_ref(&extent_range::size));

    init_multi_array_ref(extents.begin());
  }